

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O2

void __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::grow_capacity
          (heterogeneous_queue<libtorrent::alert> *this,int size)

{
  ushort uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  _Head_base<0UL,_char_*,_false> _Var7;
  int iVar8;
  long lVar9;
  _Head_base<0UL,_char_*,_false> _Var10;
  ushort *puVar11;
  _Head_base<0UL,_char_*,_false> _Var12;
  
  iVar2 = this->m_capacity;
  iVar8 = 0x80;
  if (0x55 < iVar2) {
    iVar8 = (iVar2 * 3) / 2;
  }
  if (iVar8 <= size) {
    iVar8 = size;
  }
  _Var7._M_head_impl = (char *)malloc((long)(iVar2 + iVar8));
  if (_Var7._M_head_impl != (char *)0x0) {
    _Var10._M_head_impl =
         (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
         super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    puVar11 = (ushort *)(_Var10._M_head_impl + this->m_size);
    _Var12._M_head_impl = _Var7._M_head_impl;
    while (_Var10._M_head_impl < puVar11) {
      uVar3 = *(undefined4 *)((long)_Var10._M_head_impl + 4);
      uVar4 = *(undefined4 *)((long)_Var10._M_head_impl + 8);
      uVar5 = *(undefined4 *)((long)_Var10._M_head_impl + 0xc);
      *(undefined4 *)_Var12._M_head_impl = *(undefined4 *)_Var10._M_head_impl;
      *(undefined4 *)(_Var12._M_head_impl + 4) = uVar3;
      *(undefined4 *)(_Var12._M_head_impl + 8) = uVar4;
      *(undefined4 *)(_Var12._M_head_impl + 0xc) = uVar5;
      uVar6 = *(ushort *)((long)_Var10._M_head_impl + 2);
      lVar9 = (long)_Var10._M_head_impl + (ulong)(byte)uVar6 + 0x10;
      uVar1 = *(ushort *)_Var10._M_head_impl;
      (**(code **)((long)_Var10._M_head_impl + 8))
                (_Var12._M_head_impl + (ulong)(byte)uVar6 + 0x10,lVar9);
      _Var12._M_head_impl = _Var12._M_head_impl + (ulong)(byte)uVar6 + 0x10 + uVar1;
      _Var10._M_head_impl = (char *)(lVar9 + (ulong)uVar1);
    }
    _Var10._M_head_impl =
         (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
         super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
    super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl = _Var7._M_head_impl;
    this->m_capacity = this->m_capacity + iVar8;
    free(_Var10._M_head_impl);
    return;
  }
  aux::throw_ex<std::bad_alloc>();
}

Assistant:

void grow_capacity(int const size)
		{
			int const amount_to_grow = (std::max)(size
				, (std::max)(m_capacity * 3 / 2, 128));

			// we use malloc() to guarantee alignment
			std::unique_ptr<char, aux::free_deleter> new_storage(
				static_cast<char*>(std::malloc(std::size_t(m_capacity + amount_to_grow)))
				, aux::free_deleter());

			if (!new_storage)
				aux::throw_ex<std::bad_alloc>();

			char* src = m_storage.get();
			char* dst = new_storage.get();
			char const* const end = m_storage.get() + m_size;
			while (src < end)
			{
				header_t* src_hdr = reinterpret_cast<header_t*>(src);
				new (dst) header_t(*src_hdr);
				src += sizeof(header_t) + src_hdr->pad_bytes;
				dst += sizeof(header_t) + src_hdr->pad_bytes;
				int const len = src_hdr->len;
				TORRENT_ASSERT(src + len <= end);
				// this is no-throw
				src_hdr->move(dst, src);
				src_hdr->~header_t();
				src += len;
				dst += len;
			}

			m_storage.swap(new_storage);
			m_capacity += amount_to_grow;

#ifdef TORRENT_ADDRESS_SANITIZER
			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, m_storage.get()
				, m_storage.get() + m_size);
#endif
		}